

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# epoll-test.c
# Opt level: O0

void * datagram_connector(void *arg)

{
  int iVar1;
  undefined1 local_31;
  sockaddr *psStack_30;
  uint8_t data;
  undefined1 local_24 [8];
  sockaddr_in addr;
  int sock;
  void *arg_local;
  
  unique0x1000018b = arg;
  addr.sin_zero._0_4_ = socket(2,0x80002,0);
  if ((int)addr.sin_zero._0_4_ < 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x67a,"sock >= 0");
  }
  memset(local_24,0,0x10);
  local_24._0_2_ = 2;
  local_24._2_2_ = htons(0x539);
  iVar1 = inet_pton(2,"127.0.0.1",local_24 + 4);
  if (iVar1 != 1) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x67f,"inet_pton(AF_INET, \"127.0.0.1\", &addr.sin_addr) == 1");
  }
  psStack_30 = (sockaddr *)local_24;
  iVar1 = connect(addr.sin_zero._0_4_,psStack_30,0x10);
  if (iVar1 != 0) {
    microatf_fail_require
              ("%s:%d: %s not met",
               "/workspace/llm4binary/github/license_c_cmakelists/jiixyj[P]epoll-shim/test/epoll-test.c"
               ,0x682,"connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0");
  }
  fprintf(_stderr,"got client\n");
  local_31 = 0;
  write(addr.sin_zero._0_4_,&local_31,0);
  usleep(500000);
  close(addr.sin_zero._0_4_);
  return (void *)0x0;
}

Assistant:

static void *
datagram_connector(void *arg)
{
	(void)arg;

	int sock = socket(PF_INET, SOCK_DGRAM | SOCK_CLOEXEC, 0);
	ATF_REQUIRE(sock >= 0);

	struct sockaddr_in addr = { 0 };
	addr.sin_family = AF_INET;
	addr.sin_port = htons(1337);
	ATF_REQUIRE(inet_pton(AF_INET, "127.0.0.1", &addr.sin_addr) == 1);

	ATF_REQUIRE(
	    connect(sock, (struct sockaddr const *)&addr, sizeof(addr)) == 0);

	fprintf(stderr, "got client\n");

	uint8_t data = '\0';
	write(sock, &data, 0);
	usleep(500000);
	close(sock);

	return NULL;
}